

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool ssl_prefs_check(Curl_easy *data)

{
  long lVar1;
  long sslver;
  Curl_easy *data_local;
  
  lVar1 = (data->set).ssl.primary.version;
  if ((lVar1 < 0) || (7 < lVar1)) {
    Curl_failf(data,"Unrecognized parameter value passed via CURLOPT_SSLVERSION");
    data_local._7_1_ = false;
  }
  else if ((((data->set).ssl.primary.version_max & 0xfffffffffffeffffU) == 0) ||
          (lVar1 <= (data->set).ssl.primary.version_max >> 0x10)) {
    data_local._7_1_ = true;
  }
  else {
    Curl_failf(data,"CURL_SSLVERSION_MAX incompatible with CURL_SSLVERSION");
    data_local._7_1_ = false;
  }
  return data_local._7_1_;
}

Assistant:

static bool ssl_prefs_check(struct Curl_easy *data)
{
  /* check for CURLOPT_SSLVERSION invalid parameter value */
  const long sslver = data->set.ssl.primary.version;
  if((sslver < 0) || (sslver >= CURL_SSLVERSION_LAST)) {
    failf(data, "Unrecognized parameter value passed via CURLOPT_SSLVERSION");
    return FALSE;
  }

  switch(data->set.ssl.primary.version_max) {
  case CURL_SSLVERSION_MAX_NONE:
  case CURL_SSLVERSION_MAX_DEFAULT:
    break;

  default:
    if((data->set.ssl.primary.version_max >> 16) < sslver) {
      failf(data, "CURL_SSLVERSION_MAX incompatible with CURL_SSLVERSION");
      return FALSE;
    }
  }

  return TRUE;
}